

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<asd::Header<asd::version<2ul>>&,std::vector<signed_char,std::allocator<signed_char>>const&>
::load_impl_sequence<0ul,1ul>
          (argument_loader<asd::Header<asd::version<2ul>>&,std::vector<signed_char,std::allocator<signed_char>>const&>
           *this,long call)

{
  bool bVar1;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x18),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if (bVar1) {
    bVar1 = list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char>::load
                      ((list_caster<std::vector<signed_char,_std::allocator<signed_char>_>,_signed_char>
                        *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                       SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
    return bVar1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is]))) {
            return false;
        }
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...}) {
            if (!r) {
                return false;
            }
        }
#endif
        return true;
    }